

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_53f39::OpenXrProgram::CreateInstanceInternal(OpenXrProgram *this)

{
  pointer *this_00;
  XrResult res;
  element_type *peVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  back_insert_iterator<std::vector<const_char_*,_std::allocator<const_char_*>_>_> bVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  size_type sVar6;
  undefined4 local_228 [2];
  XrInstanceCreateInfo createInfo;
  undefined1 local_b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  graphicsExtensions;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  platformExtensions;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions;
  allocator local_31;
  string local_30 [32];
  OpenXrProgram *local_10;
  OpenXrProgram *this_local;
  
  local_10 = this;
  if (this->m_instance != (XrInstance)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Check failed",&local_31);
    Throw((string *)local_30,"m_instance == XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:177"
         );
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             &platformExtensions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  peVar1 = std::__shared_ptr_access<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_platformPlugin);
  (*peVar1->_vptr_IPlatformPlugin[3])(local_78);
  cVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78);
  cVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
  bVar4 = std::back_inserter<std::vector<char_const*,std::allocator<char_const*>>>
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                     &platformExtensions.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  graphicsExtensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<char_const*,std::allocator<char_const*>>>,(anonymous_namespace)::OpenXrProgram::CreateInstanceInternal()::_lambda(std::__cxx11::string_const&)_1_>
                          (cVar2._M_current,cVar3._M_current,bVar4.container);
  peVar5 = std::__shared_ptr_access<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_graphicsPlugin);
  (*peVar5->_vptr_IGraphicsPlugin[2])(local_b8);
  cVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_b8);
  cVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b8);
  bVar4 = std::back_inserter<std::vector<char_const*,std::allocator<char_const*>>>
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                     &platformExtensions.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  createInfo.enabledExtensionNames =
       (char **)std::
                transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<char_const*,std::allocator<char_const*>>>,(anonymous_namespace)::OpenXrProgram::CreateInstanceInternal()::_lambda(std::__cxx11::string_const&)_2_>
                          (cVar2._M_current,cVar3._M_current,bVar4.container);
  memset(local_228,0,0x148);
  local_228[0] = 3;
  peVar1 = std::__shared_ptr_access<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_platformPlugin);
  createInfo.type = (*peVar1->_vptr_IPlatformPlugin[2])();
  createInfo._4_4_ = extraout_var;
  this_00 = &platformExtensions.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  sVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_00);
  createInfo.enabledApiLayerNames._0_4_ = (undefined4)sVar6;
  createInfo._312_8_ =
       std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                 ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_00);
  strcpy((char *)&createInfo.createFlags,"HelloXR");
  createInfo.applicationInfo.engineName[0x7c] = '/';
  createInfo.applicationInfo.engineName[0x7d] = '\0';
  createInfo.applicationInfo.engineName[0x7e] = '\0';
  createInfo.applicationInfo.engineName[0x7f] = '\0';
  createInfo.applicationInfo.engineVersion = 0x10000;
  res = xrCreateInstance(local_228,&this->m_instance);
  CheckXrResult(res,"xrCreateInstance(&createInfo, &m_instance)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:200"
               );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             &platformExtensions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CreateInstanceInternal() {
        CHECK(m_instance == XR_NULL_HANDLE);

        // Create union of extensions required by platform and graphics plugins.
        std::vector<const char*> extensions;

        // Transform platform and graphics extension std::strings to C strings.
        const std::vector<std::string> platformExtensions = m_platformPlugin->GetInstanceExtensions();
        std::transform(platformExtensions.begin(), platformExtensions.end(), std::back_inserter(extensions),
                       [](const std::string& ext) { return ext.c_str(); });
        const std::vector<std::string> graphicsExtensions = m_graphicsPlugin->GetInstanceExtensions();
        std::transform(graphicsExtensions.begin(), graphicsExtensions.end(), std::back_inserter(extensions),
                       [](const std::string& ext) { return ext.c_str(); });

        XrInstanceCreateInfo createInfo{XR_TYPE_INSTANCE_CREATE_INFO};
        createInfo.next = m_platformPlugin->GetInstanceCreateExtension();
        createInfo.enabledExtensionCount = (uint32_t)extensions.size();
        createInfo.enabledExtensionNames = extensions.data();

        strcpy(createInfo.applicationInfo.applicationName, "HelloXR");

        // Current version is 1.1.x, but hello_xr only requires 1.0.x
        createInfo.applicationInfo.apiVersion = XR_API_VERSION_1_0;

        CHECK_XRCMD(xrCreateInstance(&createInfo, &m_instance));
    }